

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_file_putByte(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue JVar4;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  iVar3 = 6;
  if (__stream != (FILE *)0x0) {
    iVar1 = JS_ToInt32(ctx,&local_24,*argv);
    if (iVar1 == 0) {
      JVar2._0_4_ = fputc(local_24,__stream);
      JVar2._4_4_ = 0;
      iVar3 = 0;
      goto LAB_0010fd65;
    }
  }
  JVar2.float64 = 0.0;
LAB_0010fd65:
  JVar4.tag = iVar3;
  JVar4.u.float64 = JVar2.float64;
  return JVar4;
}

Assistant:

static JSValue js_std_file_putByte(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    if (!f)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &c, argv[0]))
        return JS_EXCEPTION;
    c = fputc(c, f);
    return JS_NewInt32(ctx, c);
}